

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O0

void __thiscall ktxInfo::ktxInfo(ktxInfo *this)

{
  undefined8 *in_RDI;
  commandOptions *in_stack_000000b8;
  string *in_stack_000000c0;
  string *in_stack_000000c8;
  ktxApp *in_stack_000000d0;
  undefined **this_00;
  
  this_00 = &PTR_main_00147a08;
  *in_RDI = &PTR_main_00147a08;
  ktxApp::ktxApp(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  *in_RDI = this_00;
  ktxApp::commandOptions::commandOptions((commandOptions *)this_00);
  return;
}

Assistant:

ktxInfo::ktxInfo() : ktxApp(myversion, mydefversion, options)
{

}